

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O0

AllTrueMatcher * Catch::Matchers::AllTrue(void)

{
  AllTrueMatcher *in_RDI;
  
  memset(in_RDI,0,0x28);
  AllTrueMatcher::AllTrueMatcher(in_RDI);
  return in_RDI;
}

Assistant:

AllTrueMatcher AllTrue() { return AllTrueMatcher{}; }